

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

void md_analyze_bracket(MD_CTX *ctx,int mark_index)

{
  MD_MARK *pMVar1;
  MD_MARK *pMVar2;
  int iVar3;
  int in_ESI;
  MD_CTX *in_RDI;
  MD_MARK *opener;
  int opener_index;
  MD_MARK *mark;
  
  pMVar1 = in_RDI->marks;
  if ((pMVar1[in_ESI].flags & 1) == 0) {
    if (-1 < in_RDI->opener_stacks[0xe].top) {
      iVar3 = md_mark_stack_pop(in_RDI,in_RDI->opener_stacks + 0xe);
      pMVar2 = in_RDI->marks;
      pMVar2[iVar3].next = in_ESI;
      pMVar1[in_ESI].prev = iVar3;
      if (in_RDI->unresolved_link_tail < 0) {
        in_RDI->unresolved_link_head = iVar3;
      }
      else {
        in_RDI->marks[in_RDI->unresolved_link_tail].prev = iVar3;
      }
      in_RDI->unresolved_link_tail = iVar3;
      pMVar2[iVar3].prev = -1;
    }
  }
  else {
    if (-1 < in_RDI->opener_stacks[0xe].top) {
      iVar3 = in_RDI->opener_stacks[0xe].top;
      in_RDI->marks[iVar3].flags = in_RDI->marks[iVar3].flags | 0x20;
    }
    md_mark_stack_push(in_RDI,in_RDI->opener_stacks + 0xe,in_ESI);
  }
  return;
}

Assistant:

static void
md_analyze_bracket(MD_CTX* ctx, int mark_index)
{
    /* We cannot really resolve links here as for that we would need
     * more context. E.g. a following pair of brackets (reference link),
     * or enclosing pair of brackets (if the inner is the link, the outer
     * one cannot be.)
     *
     * Therefore we here only construct a list of '[' ']' pairs ordered by
     * position of the closer. This allows us to analyze what is or is not
     * link in the right order, from inside to outside in case of nested
     * brackets.
     *
     * The resolving itself is deferred to md_resolve_links().
     */

    MD_MARK* mark = &ctx->marks[mark_index];

    if(mark->flags & MD_MARK_POTENTIAL_OPENER) {
        if(BRACKET_OPENERS.top >= 0)
            ctx->marks[BRACKET_OPENERS.top].flags |= MD_MARK_HASNESTEDBRACKETS;

        md_mark_stack_push(ctx, &BRACKET_OPENERS, mark_index);
        return;
    }

    if(BRACKET_OPENERS.top >= 0) {
        int opener_index = md_mark_stack_pop(ctx, &BRACKET_OPENERS);
        MD_MARK* opener = &ctx->marks[opener_index];

        /* Interconnect the opener and closer. */
        opener->next = mark_index;
        mark->prev = opener_index;

        /* Add the pair into a list of potential links for md_resolve_links().
         * Note we misuse opener->prev for this as opener->next points to its
         * closer. */
        if(ctx->unresolved_link_tail >= 0)
            ctx->marks[ctx->unresolved_link_tail].prev = opener_index;
        else
            ctx->unresolved_link_head = opener_index;
        ctx->unresolved_link_tail = opener_index;
        opener->prev = -1;
    }
}